

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullFormatter.h
# Opt level: O0

NullFormatter * __thiscall
SLogLib::NullFormatter::formatMessage_abi_cxx11_(NullFormatter *this,Message *msg)

{
  ostream *this_00;
  string *in_RDX;
  ostringstream local_198 [8];
  ostringstream _stream;
  Message *msg_local;
  NullFormatter *this_local;
  
  if (*(int *)(msg + 8) == 1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    this_00 = std::operator<<((ostream *)local_198,in_RDX);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  else {
    std::__cxx11::string::string((string *)this,in_RDX);
  }
  return this;
}

Assistant:

inline std::string formatMessage(const Message& msg) const override
	{
		if(mNewLine == NewLine::Yes)
		{
			std::ostringstream _stream;
			_stream << msg.mUserMessage << std::endl;
			return _stream.str();
		}
		else
		{
			return msg.mUserMessage;
		}
	}